

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O2

bool __thiscall llvm::yaml::isNumeric(yaml *this,StringRef S)

{
  bool bVar1;
  char cVar2;
  size_type sVar3;
  void *pvVar4;
  char *pcVar5;
  StringRef RHS;
  StringRef RHS_00;
  StringRef RHS_01;
  StringRef RHS_02;
  StringRef RHS_03;
  StringRef RHS_04;
  StringRef RHS_05;
  StringRef Prefix;
  StringRef Prefix_00;
  StringRef Chars;
  StringRef Prefix_01;
  StringRef RHS_06;
  StringRef Prefix_02;
  StringRef Prefix_03;
  StringRef SVar6;
  size_t sStack_50;
  StringRef local_48;
  undefined1 auStack_38 [8];
  StringRef Tail;
  ulong uStack_20;
  
  pcVar5 = S.Data;
  if (((pcVar5 != (char *)0x0) &&
      (SVar6.Length = 1, SVar6.Data = "+", Tail.Length = (size_t)this,
      bVar1 = StringRef::equals((StringRef *)&Tail.Length,SVar6), !bVar1)) &&
     (RHS.Length = 1, RHS.Data = "-", bVar1 = StringRef::equals((StringRef *)&Tail.Length,RHS),
     !bVar1)) {
    RHS_00.Length = 4;
    RHS_00.Data = ".nan";
    bVar1 = StringRef::equals((StringRef *)&Tail.Length,RHS_00);
    if (bVar1) {
      return true;
    }
    RHS_01.Length = 4;
    RHS_01.Data = ".NaN";
    bVar1 = StringRef::equals((StringRef *)&Tail.Length,RHS_01);
    if (bVar1) {
      return true;
    }
    RHS_02.Length = 4;
    RHS_02.Data = ".NAN";
    bVar1 = StringRef::equals((StringRef *)&Tail.Length,RHS_02);
    if (bVar1) {
      return true;
    }
    cVar2 = StringRef::front((StringRef *)&Tail.Length);
    if ((cVar2 == '-') || (cVar2 = StringRef::front((StringRef *)&Tail.Length), cVar2 == '+')) {
      _auStack_38 = StringRef::drop_front((StringRef *)&Tail.Length,1);
    }
    else {
      Tail.Data = pcVar5;
      auStack_38 = (undefined1  [8])Tail.Length;
    }
    RHS_03.Length = 4;
    RHS_03.Data = ".inf";
    bVar1 = StringRef::equals((StringRef *)auStack_38,RHS_03);
    if (bVar1) {
      return true;
    }
    RHS_04.Length = 4;
    RHS_04.Data = ".Inf";
    bVar1 = StringRef::equals((StringRef *)auStack_38,RHS_04);
    if (bVar1) {
      return true;
    }
    RHS_05.Length = 4;
    RHS_05.Data = ".INF";
    bVar1 = StringRef::equals((StringRef *)auStack_38,RHS_05);
    if (bVar1) {
      return true;
    }
    Prefix.Length = 2;
    Prefix.Data = "0o";
    bVar1 = StringRef::startswith((StringRef *)&Tail.Length,Prefix);
    if (bVar1) {
      if ((char *)0x2 < pcVar5) {
        local_48 = StringRef::drop_front((StringRef *)&Tail.Length,2);
        pcVar5 = "01234567";
        sStack_50 = 8;
LAB_00b58749:
        Chars.Length = sStack_50;
        Chars.Data = pcVar5;
        sVar3 = StringRef::find_first_not_of(&local_48,Chars,0);
        return sVar3 == 0xffffffffffffffff;
      }
    }
    else {
      Prefix_00.Length = 2;
      Prefix_00.Data = "0x";
      bVar1 = StringRef::startswith((StringRef *)&Tail.Length,Prefix_00);
      if (bVar1) {
        if ((char *)0x2 < pcVar5) {
          local_48 = StringRef::drop_front((StringRef *)&Tail.Length,2);
          pcVar5 = "0123456789abcdefABCDEF";
          sStack_50 = 0x16;
          goto LAB_00b58749;
        }
      }
      else {
        stack0xffffffffffffffd8 = _auStack_38;
        Prefix_01.Length = 1;
        Prefix_01.Data = ".";
        bVar1 = StringRef::startswith((StringRef *)&Tail.Length,Prefix_01);
        if (bVar1) {
          RHS_06.Length = 1;
          RHS_06.Data = ".";
          bVar1 = StringRef::equals((StringRef *)&Tail.Length,RHS_06);
          if (bVar1) {
            return false;
          }
          if (1 < uStack_20) {
            cVar2 = StringRef::operator[]((StringRef *)&Tail.Length,1);
            pvVar4 = memchr("0123456789",(int)cVar2,0xb);
            if (pvVar4 == (void *)0x0) {
              return false;
            }
          }
        }
        Prefix_02.Length = 1;
        Prefix_02.Data = "E";
        bVar1 = StringRef::startswith((StringRef *)&Tail.Length,Prefix_02);
        if ((!bVar1) &&
           (Prefix_03.Length = 1, Prefix_03.Data = "e",
           bVar1 = StringRef::startswith((StringRef *)&Tail.Length,Prefix_03), !bVar1)) {
          join_0x00000010_0x00000000_ =
               isNumeric::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)&isNumeric(llvm::StringRef)::skipDigits,
                          stack0xffffffffffffffd8);
          if (Tail._16_8_ == 0) {
            return true;
          }
          cVar2 = StringRef::front((StringRef *)&Tail.Length);
          if (cVar2 == '.') {
            join_0x00000010_0x00000000_ = StringRef::drop_front((StringRef *)&Tail.Length,1);
            join_0x00000010_0x00000000_ =
                 isNumeric::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)&isNumeric(llvm::StringRef)::skipDigits,
                            join_0x00000010_0x00000000_);
            if (Tail._16_8_ == 0) {
              return true;
            }
          }
          cVar2 = StringRef::front((StringRef *)&Tail.Length);
          if ((cVar2 == 'e') || (cVar2 = StringRef::front((StringRef *)&Tail.Length), cVar2 == 'E'))
          {
            join_0x00000010_0x00000000_ = StringRef::drop_front((StringRef *)&Tail.Length,1);
            if ((Tail._16_8_ != 0) &&
               (((cVar2 = StringRef::front((StringRef *)&Tail.Length), cVar2 != '+' &&
                 (cVar2 = StringRef::front((StringRef *)&Tail.Length), cVar2 != '-')) ||
                (join_0x00000010_0x00000000_ = StringRef::drop_front((StringRef *)&Tail.Length,1),
                Tail._16_8_ != 0)))) {
              SVar6 = isNumeric::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)&isNumeric(llvm::StringRef)::skipDigits,
                                 stack0xffffffffffffffd8);
              return SVar6.Length == 0;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

inline bool isNumeric(StringRef S) {
  const static auto skipDigits = [](StringRef Input) {
    return Input.drop_front(
        std::min(Input.find_first_not_of("0123456789"), Input.size()));
  };

  // Make S.front() and S.drop_front().front() (if S.front() is [+-]) calls
  // safe.
  if (S.empty() || S.equals("+") || S.equals("-"))
    return false;

  if (S.equals(".nan") || S.equals(".NaN") || S.equals(".NAN"))
    return true;

  // Infinity and decimal numbers can be prefixed with sign.
  StringRef Tail = (S.front() == '-' || S.front() == '+') ? S.drop_front() : S;

  // Check for infinity first, because checking for hex and oct numbers is more
  // expensive.
  if (Tail.equals(".inf") || Tail.equals(".Inf") || Tail.equals(".INF"))
    return true;

  // Section 10.3.2 Tag Resolution
  // YAML 1.2 Specification prohibits Base 8 and Base 16 numbers prefixed with
  // [-+], so S should be used instead of Tail.
  if (S.startswith("0o"))
    return S.size() > 2 &&
           S.drop_front(2).find_first_not_of("01234567") == StringRef::npos;

  if (S.startswith("0x"))
    return S.size() > 2 && S.drop_front(2).find_first_not_of(
                               "0123456789abcdefABCDEF") == StringRef::npos;

  // Parse float: [-+]? (\. [0-9]+ | [0-9]+ (\. [0-9]* )?) ([eE] [-+]? [0-9]+)?
  S = Tail;

  // Handle cases when the number starts with '.' and hence needs at least one
  // digit after dot (as opposed by number which has digits before the dot), but
  // doesn't have one.
  if (S.startswith(".") &&
      (S.equals(".") ||
       (S.size() > 1 && std::strchr("0123456789", S[1]) == nullptr)))
    return false;

  if (S.startswith("E") || S.startswith("e"))
    return false;

  enum ParseState {
    Default,
    FoundDot,
    FoundExponent,
  };
  ParseState State = Default;

  S = skipDigits(S);

  // Accept decimal integer.
  if (S.empty())
    return true;

  if (S.front() == '.') {
    State = FoundDot;
    S = S.drop_front();
  } else if (S.front() == 'e' || S.front() == 'E') {
    State = FoundExponent;
    S = S.drop_front();
  } else {
    return false;
  }

  if (State == FoundDot) {
    S = skipDigits(S);
    if (S.empty())
      return true;

    if (S.front() == 'e' || S.front() == 'E') {
      State = FoundExponent;
      S = S.drop_front();
    } else {
      return false;
    }
  }

  assert(State == FoundExponent && "Should have found exponent at this point.");
  if (S.empty())
    return false;

  if (S.front() == '+' || S.front() == '-') {
    S = S.drop_front();
    if (S.empty())
      return false;
  }

  return skipDigits(S).empty();
}